

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int bindText(sqlite3_stmt *pStmt,int i,void *zData,int nData,_func_void_void_ptr *xDel,u8 encoding)

{
  sqlite3 *psVar1;
  uint uVar2;
  long lVar3;
  Mem *pMem;
  
  uVar2 = vdbeUnbind((Vdbe *)pStmt,i);
  if (uVar2 == 0) {
    if (zData == (void *)0x0) {
      uVar2 = 0;
    }
    else {
      lVar3 = *(long *)(pStmt + 0xa0);
      pMem = (Mem *)(lVar3 + (long)i * 0x38 + -0x38);
      uVar2 = sqlite3VdbeMemSetStr(pMem,(char *)zData,nData,encoding,xDel);
      if ((encoding != '\0') && (uVar2 == 0)) {
        lVar3 = lVar3 + (long)i * 0x38;
        uVar2 = 0;
        if (((*(byte *)(lVar3 + -0x30) & 2) != 0) &&
           (uVar2 = 0, *(u8 *)(lVar3 + -0x2e) != *(u8 *)(*(long *)pStmt + 0x52))) {
          uVar2 = sqlite3VdbeMemTranslate(pMem,*(u8 *)(*(long *)pStmt + 0x52));
        }
      }
      psVar1 = *(sqlite3 **)pStmt;
      psVar1->errCode = uVar2;
      if ((uVar2 != 0) || (psVar1->pErr != (sqlite3_value *)0x0)) {
        sqlite3ErrorFinish(psVar1,uVar2);
      }
      psVar1 = *(sqlite3 **)pStmt;
      if ((uVar2 == 0xc0a) || (psVar1->mallocFailed != '\0')) {
        apiOomError(psVar1);
        uVar2 = 7;
      }
      else {
        uVar2 = uVar2 & psVar1->errMask;
      }
    }
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
  }
  else if ((code *)0x1 < xDel + 1) {
    (*xDel)(zData);
  }
  return uVar2;
}

Assistant:

static int bindText(
  sqlite3_stmt *pStmt,   /* The statement to bind against */
  int i,                 /* Index of the parameter to bind */
  const void *zData,     /* Pointer to the data to be bound */
  int nData,             /* Number of bytes of data to be bound */
  void (*xDel)(void*),   /* Destructor for the data */
  u8 encoding            /* Encoding for the data */
){
  Vdbe *p = (Vdbe *)pStmt;
  Mem *pVar;
  int rc;

  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    if( zData!=0 ){
      pVar = &p->aVar[i-1];
      rc = sqlite3VdbeMemSetStr(pVar, zData, nData, encoding, xDel);
      if( rc==SQLITE_OK && encoding!=0 ){
        rc = sqlite3VdbeChangeEncoding(pVar, ENC(p->db));
      }
      sqlite3Error(p->db, rc);
      rc = sqlite3ApiExit(p->db, rc);
    }
    sqlite3_mutex_leave(p->db->mutex);
  }else if( xDel!=SQLITE_STATIC && xDel!=SQLITE_TRANSIENT ){
    xDel((void*)zData);
  }
  return rc;
}